

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

tchar_t * NodeStr2(anynode *AnyNode,fourcc_t ClassId,int No)

{
  anynode *Any;
  nodeclass *Class_00;
  nodeclass *Class;
  nodecontext *Context;
  int No_local;
  fourcc_t ClassId_local;
  anynode *AnyNode_local;
  
  if (AnyNode != (anynode *)0x0) {
    Any = (anynode *)**(undefined8 **)((long)AnyNode + 8);
    Class_00 = NodeContext_FindClass(Any,ClassId);
    if (Class_00 == (nodeclass *)0x0) {
      if (*(long *)((long)Any + 0xa0) == 0) {
        AnyNode_local = "";
      }
      else {
        AnyNode_local = (anynode *)(**(code **)((long)Any + 0xa0))(Any,ClassId,No);
      }
    }
    else {
      AnyNode_local = NodeClass_Str(AnyNode,Class_00,No);
    }
    return (tchar_t *)AnyNode_local;
  }
  __assert_fail("(const void*)(AnyNode)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x65b,"const tchar_t *NodeStr2(anynode *, fourcc_t, int)");
}

Assistant:

const tchar_t* NodeStr2(anynode* AnyNode,fourcc_t ClassId,int No)
{
    nodecontext* Context = Node_Context(AnyNode);
    const nodeclass* Class = NodeContext_FindClass(Context,ClassId);
    if (Class)
        return NodeClass_Str(AnyNode,Class,No);
    if (Context->ExternalStr)
        return Context->ExternalStr(Context,ClassId,No);
    return T("");
}